

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

istream * operator>>(istream *in,lda_math_mode *mmode)

{
  bool bVar1;
  invalid_option_value *this;
  lda_math_mode lVar2;
  string token;
  
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  std::operator>>(in,(string *)&token);
  bVar1 = std::operator==(&token,"simd");
  lVar2 = USE_SIMD;
  if (!bVar1) {
    bVar1 = std::operator==(&token,"accuracy");
    lVar2 = USE_PRECISE;
    if (!bVar1) {
      bVar1 = std::operator==(&token,"precise");
      if (!bVar1) {
        bVar1 = std::operator==(&token,"fast-approx");
        lVar2 = USE_FAST_APPROX;
        if (!bVar1) {
          bVar1 = std::operator==(&token,"approx");
          if (!bVar1) {
            this = (invalid_option_value *)__cxa_allocate_exception(0xc0);
            boost::program_options::invalid_option_value::invalid_option_value
                      (this,(string *)&token);
            __cxa_throw(this,&boost::program_options::invalid_option_value::typeinfo,
                        boost::program_options::error_with_option_name::~error_with_option_name);
          }
        }
      }
    }
  }
  *mmode = lVar2;
  std::__cxx11::string::~string((string *)&token);
  return in;
}

Assistant:

std::istream &operator>>(std::istream &in, lda_math_mode &mmode)
{
  using namespace boost::program_options;

  std::string token;
  in >> token;
  if (token == "simd")
    mmode = USE_SIMD;
  else if (token == "accuracy" || token == "precise")
    mmode = USE_PRECISE;
  else if (token == "fast-approx" || token == "approx")
    mmode = USE_FAST_APPROX;
  else
    throw boost::program_options::invalid_option_value(token);
  return in;
}